

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::Version::LevelFileNumIterator::Prev(LevelFileNumIterator *this)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0xb7,"virtual void leveldb::Version::LevelFileNumIterator::Prev()");
  }
  if (this->index_ == 0) {
    uVar3 = (uint32_t)
            ((ulong)((long)(this->flist_->
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->flist_->
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  else {
    uVar3 = this->index_ - 1;
  }
  this->index_ = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Prev() override {
    assert(Valid());
    if (index_ == 0) {
      index_ = flist_->size();  // Marks as invalid
    } else {
      index_--;
    }
  }